

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<2048,Blob<160>>
               (hashfunc<Blob<160>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  pfHash p_Var2;
  size_type sVar3;
  undefined4 in_ECX;
  uint in_EDX;
  char *pcVar4;
  uint in_ESI;
  byte in_R8B;
  byte in_R9B;
  bool result;
  Blob<160> h;
  keytype k;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> hashes;
  undefined3 uVar5;
  undefined4 in_stack_fffffffffffffeb4;
  byte bVar7;
  undefined4 uVar6;
  Blob<2048> *in_stack_fffffffffffffeb8;
  uint8_t in_stack_fffffffffffffec7;
  int in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  pfHash in_stack_fffffffffffffed0;
  undefined1 local_128 [211];
  uint8_t in_stack_ffffffffffffffab;
  uint8_t in_stack_ffffffffffffffac;
  uint8_t in_stack_ffffffffffffffad;
  uint8_t in_stack_ffffffffffffffae;
  uint8_t in_stack_ffffffffffffffaf;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> *in_stack_ffffffffffffffb0;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [8];
  
  local_d = (byte)in_EDX & 1;
  local_e = (byte)in_ECX & 1;
  local_f = in_R8B & 1;
  local_10 = in_R9B & 1;
  pcVar4 = "exactly";
  if ((in_EDX & 1) != 0) {
    pcVar4 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x800,pcVar4,(ulong)in_ESI);
  std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::vector
            ((vector<Blob<160>,_std::allocator<Blob<160>_>_> *)0x16f67f);
  Blob<2048>::Blob((Blob<2048> *)local_128);
  memset(local_128,0,0x100);
  if ((local_d & 1) != 0) {
    Blob<160>::Blob((Blob<160> *)&stack0xfffffffffffffeb8);
    p_Var2 = hashfunc::operator_cast_to_function_pointer(local_8);
    (*p_Var2)(local_128,0x100,0,&stack0xfffffffffffffeb8);
    std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::push_back
              ((vector<Blob<160>,_std::allocator<Blob<160>_>_> *)
               CONCAT44(in_stack_fffffffffffffeb4,in_ESI),(value_type *)CONCAT44(in_EDX,in_ECX));
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<2048>,Blob<160>>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec8,
             (bool)in_stack_fffffffffffffec7,in_stack_fffffffffffffeb8,
             (vector<Blob<160>,_std::allocator<Blob<160>_>_> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_ESI));
  sVar3 = std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::size(&local_28);
  printf("%d keys\n",sVar3 & 0xffffffff);
  uVar5 = (undefined3)in_stack_fffffffffffffeb4;
  bVar7 = 1;
  bVar1 = TestHashList<Blob<160>>
                    (in_stack_ffffffffffffffb0,(bool)in_stack_ffffffffffffffaf,
                     (bool)in_stack_ffffffffffffffae,(bool)in_stack_ffffffffffffffad,
                     (bool)in_stack_ffffffffffffffac,(bool)in_stack_ffffffffffffffab);
  uVar6 = CONCAT13(bVar1 & bVar7,uVar5);
  printf("\n");
  std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::~vector
            ((vector<Blob<160>,_std::allocator<Blob<160>_>_> *)CONCAT44(uVar6,in_ESI));
  return (bool)((byte)((uint)uVar6 >> 0x18) & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive, bool testColl, bool testDist, bool drawDiagram  )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits, inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashtype h;

    hash(&k,sizeof(keytype),0,&h);

    hashes.push_back(h);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}